

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mock.hpp
# Opt level: O2

string * __thiscall
ut11::Mock<bool(int)>::GetVerifyFailTimesMessageForCount_abi_cxx11_
          (string *__return_storage_ptr__,Mock<bool(int)> *this,size_t expected,size_t actual)

{
  ostream *poVar1;
  stringstream output;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Expected function to be called ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," times was actually called ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," times");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GetVerifyFailTimesMessageForCount(std::size_t expected, std::size_t actual) const
		{
			std::stringstream output;
			output << "Expected function to be called " << expected << " times was actually called " << actual << " times";
			return output.str();
		}